

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O3

void Abc_ManCollectLatches_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLatches)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  long *plVar6;
  void **ppvVar7;
  int in_EDX;
  int Fill;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    pAVar4 = pObj->pNtk;
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar5 = pObj->pNtk;
    iVar2 = pAVar5->nTravIds;
    if ((pAVar4->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pObj->Id;
      Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar5->vTravIds).pArray[iVar1] = iVar2;
      plVar6 = (long *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      plVar6 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8);
      if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 5) {
        Abc_ManCollectLatches_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8),
                   vLatches);
      }
      uVar3 = vLatches->nSize;
      if (uVar3 == vLatches->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vLatches->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vLatches->pArray,0x80);
          }
          vLatches->pArray = ppvVar7;
          vLatches->nCap = 0x10;
        }
        else {
          if (vLatches->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vLatches->pArray,(ulong)uVar3 << 4);
          }
          vLatches->pArray = ppvVar7;
          vLatches->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar7 = vLatches->pArray;
      }
      iVar1 = vLatches->nSize;
      vLatches->nSize = iVar1 + 1;
      ppvVar7[iVar1] = pObj;
    }
  }
  return;
}

Assistant:

void Abc_ManCollectLatches_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLatches )
{
    Abc_Obj_t * pDriver;
    if ( !Abc_ObjIsLatch(pObj) )
        return;
    // skip already collected latches
    if ( Abc_NodeIsTravIdCurrent(pObj)  )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    // get the driver node feeding into the latch
    pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
    // call recursively if the driver looks like a latch output
    if ( Abc_ObjIsBo(pDriver) )
        Abc_ManCollectLatches_rec( Abc_ObjFanin0(pDriver), vLatches );
    // collect the latch
    Vec_PtrPush( vLatches, pObj );
}